

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::lts_20250127::debugging_internal::ParseBracedExpression(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ParseState copy;
  
  iVar8 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar8 + 1;
  state->steps = iVar2 + 1;
  if (0x1ffff < iVar2 || 0xff < iVar8) {
    bVar7 = false;
    goto LAB_004cbd5b;
  }
  uVar3 = (state->parse_state).mangled_idx;
  uVar4 = (state->parse_state).out_cur_idx;
  uVar5 = *(undefined8 *)&(state->parse_state).prev_name_idx;
  bVar6 = ParseTwoCharToken(state,"di");
  if (bVar6) {
    bVar6 = ParseSourceName(state);
    if (!bVar6) goto LAB_004cbcc8;
    bVar6 = ParseBracedExpression(state);
    bVar7 = true;
    if (!bVar6) goto LAB_004cbcc8;
  }
  else {
LAB_004cbcc8:
    pPVar1 = &state->parse_state;
    pPVar1->mangled_idx = uVar3;
    pPVar1->out_cur_idx = uVar4;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
    bVar6 = ParseTwoCharToken(state,"dx");
    if (bVar6) {
      bVar6 = ParseExpression(state);
      if (bVar6) {
        bVar6 = ParseBracedExpression(state);
        bVar7 = true;
        if (bVar6) goto LAB_004cbd56;
      }
    }
    pPVar1->mangled_idx = uVar3;
    pPVar1->out_cur_idx = uVar4;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
    bVar6 = ParseTwoCharToken(state,"dX");
    if (bVar6) {
      bVar6 = ParseExpression(state);
      if (bVar6) {
        bVar6 = ParseExpression(state);
        if (bVar6) {
          bVar6 = ParseBracedExpression(state);
          bVar7 = true;
          if (bVar6) goto LAB_004cbd56;
        }
      }
    }
    pPVar1->mangled_idx = uVar3;
    pPVar1->out_cur_idx = uVar4;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
    bVar7 = ParseExpression(state);
  }
LAB_004cbd56:
  iVar8 = state->recursion_depth + -1;
LAB_004cbd5b:
  state->recursion_depth = iVar8;
  return bVar7;
}

Assistant:

static bool ParseBracedExpression(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;

  ParseState copy = state->parse_state;

  if (ParseTwoCharToken(state, "di") && ParseSourceName(state) &&
      ParseBracedExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "dx") && ParseExpression(state) &&
      ParseBracedExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "dX") &&
      ParseExpression(state) && ParseExpression(state) &&
      ParseBracedExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  return ParseExpression(state);
}